

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<char>::add_state(NFA<char> *this,CharClass<char> *cc)

{
  reference this_00;
  size_type sVar1;
  CharClass<char> *cc_local;
  NFA<char> *this_local;
  
  this_00 = std::
            vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
            ::back(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states);
  sVar1 = std::
          vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
          ::size(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states);
  NFABaseState<char,_int>::add_transition(this_00,cc,(int)sVar1,false);
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states);
  return;
}

Assistant:

void add_state(const CharClass<TCHAR>& cc)
    {
        m_states.back().add_transition(cc, m_states.size());
        m_states.emplace_back();
    }